

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::ensureTextControl(QLabelPrivate *this)

{
  QWidget *this_00;
  bool focus;
  QWidgetTextControl *pQVar1;
  QTextDocument *pQVar2;
  QPalette *pal;
  long in_FS_OFFSET;
  undefined1 local_50 [16];
  code *local_40;
  undefined8 uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->field_0x340 & 0x10) != 0) && (this->control == (QWidgetTextControl *)0x0)) {
    this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    pQVar1 = (QWidgetTextControl *)operator_new(0x18);
    QWidgetTextControl::QWidgetTextControl(pQVar1,&this_00->super_QObject);
    this->control = (QWidgetTextControl *)pQVar1;
    pQVar2 = QWidgetTextControl::document(pQVar1);
    QTextDocument::setUndoRedoEnabled(SUB81(pQVar2,0));
    pQVar2 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
    QTextDocument::setDefaultFont((QFont *)pQVar2);
    if ((this->resourceProvider).super__Function_base._M_manager != (_Manager_type)0x0) {
      pQVar2 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      QTextDocument::setResourceProvider((function *)pQVar2);
    }
    QWidgetTextControl::setTextInteractionFlags
              ((QWidgetTextControl *)this->control,
               (TextInteractionFlags)
               (this->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i);
    QWidgetTextControl::setOpenExternalLinks
              ((QWidgetTextControl *)this->control,(bool)(this->field_0x341 & 1));
    pQVar1 = (QWidgetTextControl *)this->control;
    pal = QWidget::palette(this_00);
    QWidgetTextControl::setPalette(pQVar1,pal);
    pQVar1 = (QWidgetTextControl *)this->control;
    focus = QWidget::hasFocus(this_00);
    QWidgetTextControl::setFocus(pQVar1,focus,OtherFocusReason);
    local_40 = QWidget::update;
    uStack_38 = 0;
    QObject::connect<void(QWidgetTextControl::*)(QRectF_const&),void(QWidget::*)()>
              ((Object *)&stack0xffffffffffffffd0,
               (offset_in_QWidgetTextControl_to_subr)this->control,
               (ContextType *)QWidgetTextControl::updateRequest,(offset_in_QWidget_to_subr *)0x0,
               (ConnectionType)this_00);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd0);
    local_40 = QLabel::linkActivated;
    uStack_38 = 0;
    QObject::connect<void(QWidgetTextControl::*)(QString_const&),void(QLabel::*)(QString_const&)>
              ((Object *)(local_50 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
               (ContextType *)QWidgetTextControl::linkActivated,(offset_in_QLabel_to_subr *)0x0,
               (ConnectionType)this_00);
    QMetaObject::Connection::~Connection((Connection *)(local_50 + 8));
    local_40 = linkHovered;
    uStack_38 = 0;
    QObjectPrivate::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QLabelPrivate::*)(QString_const&)>
              ((Object *)local_50,(offset_in_QWidgetTextControl_to_subr)this->control,
               (Object *)QWidgetTextControl::linkHovered,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    this->field_0x340 = this->field_0x340 | 0xc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextControl() const
{
    Q_Q(const QLabel);
    if (!isTextLabel)
        return;
    if (!control) {
        control = new QWidgetTextControl(const_cast<QLabel *>(q));
        control->document()->setUndoRedoEnabled(false);
        control->document()->setDefaultFont(q->font());
        if (resourceProvider != nullptr)
            control->document()->setResourceProvider(resourceProvider);
        control->setTextInteractionFlags(textInteractionFlags);
        control->setOpenExternalLinks(openExternalLinks);
        control->setPalette(q->palette());
        control->setFocus(q->hasFocus());
        QObject::connect(control, &QWidgetTextControl::updateRequest,
                         q, qOverload<>(&QLabel::update));
        QObject::connect(control, &QWidgetTextControl::linkActivated,
                         q, &QLabel::linkActivated);
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QLabelPrivate::linkHovered);
        textLayoutDirty = true;
        textDirty = true;
    }
}